

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O0

void __thiscall asmjit::v1_14::RAAssignment::assignWorkIdsFromPhysIds(RAAssignment *this)

{
  uint uVar1;
  uint32_t uVar2;
  size_t __n;
  byte *pbVar3;
  uint32_t *puVar4;
  RARegMask *in_RDI;
  uint32_t workId;
  uint32_t physId;
  BitWordIterator<unsigned_int> it;
  uint32_t physBaseIndex;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  undefined7 in_stack_ffffffffffffff68;
  char cVar5;
  BitWordIterator<unsigned_int> *this_00;
  uint32_t local_74;
  uint local_70;
  char local_6c;
  char local_6b;
  char local_6a;
  undefined1 local_69;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 local_49;
  undefined1 *local_48;
  undefined1 local_39;
  char *local_38;
  char *local_30;
  char *local_28;
  uint32_t local_1c;
  uint32_t *local_18;
  uint32_t *local_10;
  char *local_8;
  
  this_00 = *(BitWordIterator<unsigned_int> **)(in_RDI[1]._masks._data + 2);
  __n = WorkToPhysMap::sizeOf((ulong)(in_RDI->_masks)._data[3]);
  memset(this_00,0xff,__n);
  local_68 = &local_69;
  local_49 = 0;
  local_6a = '\0';
  local_39 = 4;
  local_6b = '\x04';
  local_58 = local_68;
  local_48 = local_68;
  do {
    local_30 = &local_6a;
    local_38 = &local_6b;
    if (local_6a == local_6b) {
      return;
    }
    local_28 = &local_6a;
    local_6c = local_6a;
    cVar5 = local_6a;
    pbVar3 = RARegCount::operator[]((RARegCount *)this_00,(RegGroup)((ulong)in_RDI >> 0x38));
    local_70 = (uint)*pbVar3;
    puVar4 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                       (in_RDI,(RegGroup *)CONCAT17(cVar5,in_stack_ffffffffffffff68));
    local_1c = *puVar4;
    local_18 = &local_74;
    local_74 = local_1c;
    while (local_10 = &local_74, local_74 != 0) {
      uVar2 = Support::BitWordIterator<unsigned_int>::next(this_00);
      uVar1 = *(uint *)(*(long *)in_RDI[2]._masks._data + 0x20 + (ulong)(local_70 + uVar2) * 4);
      if (uVar1 == 0xffffffff) {
        DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
      }
      *(char *)(*(long *)(in_RDI[1]._masks._data + 2) + (ulong)uVar1) = (char)uVar2;
    }
    local_8 = &local_6a;
    local_6a = local_6a + '\x01';
  } while( true );
}

Assistant:

inline void assignWorkIdsFromPhysIds() noexcept {
    memset(_workToPhysMap, uint8_t(BaseReg::kIdBad), WorkToPhysMap::sizeOf(_layout.workCount));

    for (RegGroup group : RegGroupVirtValues{}) {
      uint32_t physBaseIndex = _layout.physIndex[group];
      Support::BitWordIterator<RegMask> it(_physToWorkMap->assigned[group]);

      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t workId = _physToWorkMap->workIds[physBaseIndex + physId];

        ASMJIT_ASSERT(workId != kWorkNone);
        _workToPhysMap->physIds[workId] = uint8_t(physId);
      }
    }
  }